

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::_first_integral_span
          (basic_substring<const_char> *this,size_t skip_start)

{
  char cVar1;
  basic_substring<const_char> bVar2;
  error_flags eVar3;
  ulong in_RSI;
  long *in_RDI;
  bool bVar4;
  char c_4;
  size_t i_4;
  char c_3;
  size_t i_3;
  char c_2;
  size_t i_2;
  char c_1;
  size_t i_1;
  char next;
  char c;
  size_t i;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  char *in_stack_fffffffffffffb98;
  undefined7 in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffba7;
  bool local_342;
  ulong local_2a8;
  ulong local_298;
  ulong local_288;
  ulong local_278;
  ulong local_268;
  char *local_230;
  size_t local_228;
  char *local_1f8;
  size_t local_1f0;
  char *local_1c8;
  size_t local_1c0;
  char *local_198;
  size_t local_190;
  char *local_168;
  size_t local_160;
  char *local_138;
  size_t local_130;
  char *local_108;
  size_t local_100;
  char *local_d8;
  size_t local_d0;
  char *local_a8;
  size_t local_a0;
  char *local_78;
  size_t local_70;
  char *local_48;
  size_t local_40;
  char *local_18;
  size_t local_10;
  
  bVar4 = true;
  if (in_RDI[1] != 0) {
    bVar4 = *in_RDI == 0;
  }
  if (bVar4) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      trap_instruction();
    }
    handle_error(0x34984b,(char *)0x1831,"check failed: %s","!empty()");
  }
  if (in_RSI == in_RDI[1]) {
    basic_substring((basic_substring<const_char> *)
                    CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
                    in_stack_fffffffffffffb98,
                    CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    local_230 = local_18;
    local_228 = local_10;
    goto LAB_00281498;
  }
  if ((ulong)in_RDI[1] <= in_RSI) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      trap_instruction();
    }
    handle_error(0x34984b,(char *)0x1834,"check failed: %s","skip_start < len");
  }
  local_2a8 = in_RSI;
  if (in_RSI + 3 <= (ulong)in_RDI[1]) {
    local_268 = in_RSI;
    if (*(char *)(*in_RDI + in_RSI) == '0') {
      cVar1 = *(char *)(*in_RDI + 1 + in_RSI);
      if ((cVar1 == 'x') || (cVar1 == 'X')) {
        for (local_278 = in_RSI + 2; local_278 < (ulong)in_RDI[1]; local_278 = local_278 + 1) {
          cVar1 = *(char *)(*in_RDI + local_278);
          if (((cVar1 < '0') || (local_342 = true, '9' < cVar1)) &&
             ((cVar1 < 'a' || (local_342 = true, 'f' < cVar1)))) {
            local_342 = '@' < cVar1 && cVar1 < 'G';
          }
          if (!local_342) {
            if (in_RSI + 2 < local_278) {
              bVar4 = true;
              if (((((cVar1 != ' ') && (bVar4 = true, cVar1 != '\n')) &&
                   (bVar4 = true, cVar1 != ']')) &&
                  ((bVar4 = true, cVar1 != ')' && (bVar4 = true, cVar1 != '}')))) &&
                 (((bVar4 = true, cVar1 != ',' &&
                   ((bVar4 = true, cVar1 != ';' && (bVar4 = true, cVar1 != '\r')))) &&
                  (bVar4 = true, cVar1 != '\t')))) {
                bVar4 = cVar1 == '\0';
              }
              if (bVar4) {
                if ((ulong)in_RDI[1] < local_278 && local_278 != 0xffffffffffffffff) {
                  eVar3 = get_error_flags();
                  if (((eVar3 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
                    trap_instruction();
                  }
                  handle_error(0x34984b,(char *)0x154e,"check failed: %s",
                               "num <= len || num == npos");
                }
                basic_substring((basic_substring<const_char> *)
                                CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
                                in_stack_fffffffffffffb98,
                                CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
                local_230 = local_a8;
                local_228 = local_a0;
                goto LAB_00281498;
              }
            }
            basic_substring((basic_substring<const_char> *)
                            CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
                            in_stack_fffffffffffffb98,
                            CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
            local_230 = local_d8;
            local_228 = local_d0;
            goto LAB_00281498;
          }
        }
        local_230 = (char *)*in_RDI;
        local_228 = in_RDI[1];
        goto LAB_00281498;
      }
      if ((cVar1 == 'b') || (cVar1 == 'B')) {
        for (local_288 = in_RSI + 2; local_288 < (ulong)in_RDI[1]; local_288 = local_288 + 1) {
          cVar1 = *(char *)(*in_RDI + local_288);
          if ((cVar1 != '0') && (cVar1 != '1')) {
            if (in_RSI + 2 < local_288) {
              bVar4 = true;
              if (((((cVar1 != ' ') && (bVar4 = true, cVar1 != '\n')) &&
                   (bVar4 = true, cVar1 != ']')) &&
                  (((bVar4 = true, cVar1 != ')' && (bVar4 = true, cVar1 != '}')) &&
                   ((bVar4 = true, cVar1 != ',' &&
                    ((bVar4 = true, cVar1 != ';' && (bVar4 = true, cVar1 != '\r')))))))) &&
                 (bVar4 = true, cVar1 != '\t')) {
                bVar4 = cVar1 == '\0';
              }
              if (bVar4) {
                if ((ulong)in_RDI[1] < local_288 && local_288 != 0xffffffffffffffff) {
                  eVar3 = get_error_flags();
                  if (((eVar3 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
                    trap_instruction();
                  }
                  handle_error(0x34984b,(char *)0x154e,"check failed: %s",
                               "num <= len || num == npos");
                }
                basic_substring((basic_substring<const_char> *)
                                CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
                                in_stack_fffffffffffffb98,
                                CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
                local_230 = local_108;
                local_228 = local_100;
                goto LAB_00281498;
              }
            }
            basic_substring((basic_substring<const_char> *)
                            CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
                            in_stack_fffffffffffffb98,
                            CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
            local_230 = local_138;
            local_228 = local_130;
            goto LAB_00281498;
          }
        }
        local_230 = (char *)*in_RDI;
        local_228 = in_RDI[1];
        goto LAB_00281498;
      }
      if ((cVar1 == 'o') || (cVar1 == 'O')) {
        for (local_298 = in_RSI + 2; local_298 < (ulong)in_RDI[1]; local_298 = local_298 + 1) {
          cVar1 = *(char *)(*in_RDI + local_298);
          if ((cVar1 < '0') || ('7' < cVar1)) {
            if (in_RSI + 2 < local_298) {
              bVar4 = true;
              if ((((cVar1 != ' ') && (bVar4 = true, cVar1 != '\n')) && (bVar4 = true, cVar1 != ']')
                  ) && ((((bVar4 = true, cVar1 != ')' && (bVar4 = true, cVar1 != '}')) &&
                         ((bVar4 = true, cVar1 != ',' &&
                          ((bVar4 = true, cVar1 != ';' && (bVar4 = true, cVar1 != '\r')))))) &&
                        (bVar4 = true, cVar1 != '\t')))) {
                bVar4 = cVar1 == '\0';
              }
              if (bVar4) {
                if ((ulong)in_RDI[1] < local_298 && local_298 != 0xffffffffffffffff) {
                  eVar3 = get_error_flags();
                  if (((eVar3 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
                    trap_instruction();
                  }
                  handle_error(0x34984b,(char *)0x154e,"check failed: %s",
                               "num <= len || num == npos");
                }
                basic_substring((basic_substring<const_char> *)
                                CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
                                in_stack_fffffffffffffb98,
                                CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
                local_230 = local_168;
                local_228 = local_160;
                goto LAB_00281498;
              }
            }
            basic_substring((basic_substring<const_char> *)
                            CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
                            in_stack_fffffffffffffb98,
                            CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
            local_230 = local_198;
            local_228 = local_190;
            goto LAB_00281498;
          }
        }
        local_230 = (char *)*in_RDI;
        local_228 = in_RDI[1];
        goto LAB_00281498;
      }
    }
    else {
      for (; local_268 < (ulong)in_RDI[1]; local_268 = local_268 + 1) {
        cVar1 = *(char *)(*in_RDI + local_268);
        if ((cVar1 < '0') || ('9' < cVar1)) {
          if (in_RSI < local_268) {
            bVar4 = true;
            if ((((((cVar1 != ' ') && (bVar4 = true, cVar1 != '\n')) && (bVar4 = true, cVar1 != ']')
                  ) && ((bVar4 = true, cVar1 != ')' && (bVar4 = true, cVar1 != '}')))) &&
                (bVar4 = true, cVar1 != ',')) &&
               (((bVar4 = true, cVar1 != ';' && (bVar4 = true, cVar1 != '\r')) &&
                (bVar4 = true, cVar1 != '\t')))) {
              bVar4 = cVar1 == '\0';
            }
            if (bVar4) {
              if ((ulong)in_RDI[1] < local_268 && local_268 != 0xffffffffffffffff) {
                eVar3 = get_error_flags();
                if (((eVar3 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
                  trap_instruction();
                }
                handle_error(0x34984b,(char *)0x154e,"check failed: %s","num <= len || num == npos")
                ;
              }
              basic_substring((basic_substring<const_char> *)
                              CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
                              in_stack_fffffffffffffb98,
                              CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
              local_230 = local_48;
              local_228 = local_40;
              goto LAB_00281498;
            }
          }
          basic_substring((basic_substring<const_char> *)
                          CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
                          in_stack_fffffffffffffb98,
                          CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
          local_230 = local_78;
          local_228 = local_70;
          goto LAB_00281498;
        }
      }
    }
  }
  for (; local_2a8 < (ulong)in_RDI[1]; local_2a8 = local_2a8 + 1) {
    cVar1 = *(char *)(*in_RDI + local_2a8);
    if ((cVar1 < '0') || ('9' < cVar1)) {
      if (in_RSI < local_2a8) {
        bVar4 = true;
        if (((((cVar1 != ' ') && (bVar4 = true, cVar1 != '\n')) && (bVar4 = true, cVar1 != ']')) &&
            (((bVar4 = true, cVar1 != ')' && (bVar4 = true, cVar1 != '}')) &&
             ((bVar4 = true, cVar1 != ',' &&
              ((bVar4 = true, cVar1 != ';' && (bVar4 = true, cVar1 != '\r')))))))) &&
           (bVar4 = true, cVar1 != '\t')) {
          bVar4 = cVar1 == '\0';
        }
        if (bVar4) {
          if ((ulong)in_RDI[1] < local_2a8 && local_2a8 != 0xffffffffffffffff) {
            eVar3 = get_error_flags();
            if (((eVar3 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
              trap_instruction();
            }
            handle_error(0x34984b,(char *)0x154e,"check failed: %s","num <= len || num == npos");
          }
          basic_substring((basic_substring<const_char> *)
                          CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
                          in_stack_fffffffffffffb98,
                          CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
          local_230 = local_1c8;
          local_228 = local_1c0;
          goto LAB_00281498;
        }
      }
      basic_substring((basic_substring<const_char> *)CONCAT17(1,in_stack_fffffffffffffba0),
                      (char *)in_RDI,CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
      local_230 = local_1f8;
      local_228 = local_1f0;
      goto LAB_00281498;
    }
  }
  local_230 = (char *)*in_RDI;
  local_228 = in_RDI[1];
LAB_00281498:
  bVar2.len = local_228;
  bVar2.str = local_230;
  return bVar2;
}

Assistant:

basic_substring _first_integral_span(size_t skip_start) const
    {
        C4_ASSERT(!empty());
        if(skip_start == len)
            return first(0);
        C4_ASSERT(skip_start < len);
        if(len >= skip_start + 3)
        {
            if(str[skip_start] != '0')
            {
                for(size_t i = skip_start; i < len; ++i)
                {
                    char c = str[i];
                    if(c < '0' || c > '9')
                        return i > skip_start && _is_delim_char(c) ? first(i) : first(0);
                }
            }
            else
            {
                char next = str[skip_start + 1];
                if(next == 'x' || next == 'X')
                {
                    skip_start += 2;
                    for(size_t i = skip_start; i < len; ++i)
                    {
                        const char c = str[i];
                        if( ! _is_hex_char(c))
                            return i > skip_start && _is_delim_char(c) ? first(i) : first(0);
                    }
                    return *this;
                }
                else if(next == 'b' || next == 'B')
                {
                    skip_start += 2;
                    for(size_t i = skip_start; i < len; ++i)
                    {
                        const char c = str[i];
                        if(c != '0' && c != '1')
                            return i > skip_start && _is_delim_char(c) ? first(i) : first(0);
                    }
                    return *this;
                }
                else if(next == 'o' || next == 'O')
                {
                    skip_start += 2;
                    for(size_t i = skip_start; i < len; ++i)
                    {
                        const char c = str[i];
                        if(c < '0' || c > '7')
                            return i > skip_start && _is_delim_char(c) ? first(i) : first(0);
                    }
                    return *this;
                }
            }
        }
        // must be a decimal, or it is not a an number
        for(size_t i = skip_start; i < len; ++i)
        {
            const char c = str[i];
            if(c < '0' || c > '9')
                return i > skip_start && _is_delim_char(c) ? first(i) : first(0);
        }
        return *this;
    }